

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementComponent::IfcElementComponent(IfcElementComponent *this)

{
  IfcElementComponent *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcElement).field_0x148,"IfcElementComponent");
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__00f89bc8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementComponent,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementComponent,_0UL> *)
             &(this->super_IfcElement).field_0x138,&PTR_construction_vtable_24__00f89cb8);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0xf89ac0;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0xf89bb0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0xf89ae8;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf89b10;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0xf89b38;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0xf89b60;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0xf89b88;
  return;
}

Assistant:

IfcElementComponent() : Object("IfcElementComponent") {}